

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  pointer pcVar3;
  string *psVar4;
  ulong uVar5;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  string dirs;
  allocator<char> local_31;
  string local_30;
  cmTarget *local_10;
  cmTarget *this_local;
  
  local_10 = this;
  TVar2 = GetType(this);
  if (((((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == STATIC_LIBRARY)) ||
       (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) ||
      ((TVar2 = GetType(this), TVar2 == INTERFACE_LIBRARY ||
       (bVar1 = IsExecutableWithExports(this), bVar1)))) &&
     (pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl), (pcVar3->BuildInterfaceIncludesAppended & 1U) == 0)) {
    pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    pcVar3->BuildInterfaceIncludesAppended = true;
    pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    this_00 = pcVar3->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE",&local_31);
    bVar1 = cmMakefile::IsOn(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
    if (bVar1) {
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3->Makefile);
      std::__cxx11::string::string((string *)local_68,(string *)psVar4);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_68,';');
      }
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar3->Makefile);
      std::__cxx11::string::operator+=((string *)local_68,(string *)psVar4);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"INTERFACE_INCLUDE_DIRECTORIES",&local_89);
        std::operator+(&local_d0,"$<BUILD_INTERFACE:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
        std::operator+(&local_b0,&local_d0,">");
        value = (char *)std::__cxx11::string::c_str();
        AppendProperty(this,&local_88,value,false);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_89);
      }
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return;
  }
  if (impl->BuildInterfaceIncludesAppended) {
    return;
  }
  impl->BuildInterfaceIncludesAppended = true;

  if (impl->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")) {
    std::string dirs = impl->Makefile->GetCurrentBinaryDirectory();
    if (!dirs.empty()) {
      dirs += ';';
    }
    dirs += impl->Makefile->GetCurrentSourceDirectory();
    if (!dirs.empty()) {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                           ("$<BUILD_INTERFACE:" + dirs + ">").c_str());
    }
  }
}